

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void * __thiscall google::protobuf::DescriptorPool::Tables::AllocateBytes(Tables *this,int size)

{
  iterator __position;
  int iVar1;
  pointer puVar2;
  _Head_base<0UL,_char_*,_false> local_10;
  
  if (size != 0) {
    iVar1 = -1;
    if (-1 < size) {
      iVar1 = size;
    }
    local_10._M_head_impl = (char *)operator_new__((long)iVar1);
    __position._M_current =
         (this->allocations_).
         super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->allocations_).
        super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
      ::_M_realloc_insert<char*>
                ((vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
                  *)&this->allocations_,__position,&local_10._M_head_impl);
      puVar2 = (this->allocations_).
               super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ((__position._M_current)->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
      .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl = local_10._M_head_impl;
      puVar2 = (this->allocations_).
               super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->allocations_).
      super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    return puVar2[-1]._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  }
  return (void *)0x0;
}

Assistant:

void* DescriptorPool::Tables::AllocateBytes(int size) {
  // TODO(kenton):  Would it be worthwhile to implement this in some more
  // sophisticated way?  Probably not for the open source release, but for
  // internal use we could easily plug in one of our existing memory pool
  // allocators...
  if (size == 0) return nullptr;

  allocations_.emplace_back(new char[size]);
  return allocations_.back().get();
}